

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void update_message(void)

{
  float fVar1;
  MESSAGE *pMVar2;
  int iVar3;
  size_t sVar4;
  int y;
  MESSAGE *tmp;
  MESSAGE *m;
  MESSAGE **p;
  int SCREEN_H;
  int SCREEN_W;
  float local_28;
  int local_24;
  MESSAGE *local_18;
  MESSAGE **local_10;
  
  iVar3 = al_get_display_width(screen);
  local_24 = al_get_display_height(screen);
  local_10 = &msg;
  local_18 = msg;
  local_24 = local_24 / 2;
  while (local_18 != (MESSAGE *)0x0) {
    if (local_18->time < 100) {
      local_18->x = local_18->x * 0.9;
      local_18->x = (float)iVar3 * 0.05 + local_18->x;
    }
    else {
      local_18->x = (float)(local_18->time + -100) + local_18->x;
    }
    local_18->y = local_18->y * 0.9;
    local_18->y = (float)local_24 * 0.1 + local_18->y;
    local_18->time = local_18->time + 1;
    fVar1 = local_18->x;
    sVar4 = strlen(local_18->text);
    local_28 = (float)((long)iVar3 + (sVar4 >> 2));
    if (fVar1 <= local_28) {
      local_10 = &local_18->next;
      local_18 = local_18->next;
    }
    else {
      *local_10 = local_18->next;
      pMVar2 = local_18->next;
      free(local_18);
      local_18 = pMVar2;
    }
    local_24 = local_24 + 0x10;
  }
  return;
}

Assistant:

void update_message()
{
   int SCREEN_W = al_get_display_width(screen);
   int SCREEN_H = al_get_display_height(screen);
   MESSAGE **p = &msg;
   MESSAGE *m = msg;
   MESSAGE *tmp;
   int y = SCREEN_H/2;

   while (m) {
      if (m->time < 100) {
	 m->x *= 0.9;
	 m->x += (float)SCREEN_W * 0.05;
      }
      else {
	 m->x += (m->time - 100);
      }

      m->y *= 0.9;
      m->y += y * 0.1;

      m->time++;

      if (m->x > SCREEN_W + strlen(m->text)/4) {
	 *p = m->next;
	 tmp = m;
	 m = m->next;
	 free(tmp);
      }
      else {
	 p = &m->next;
	 m = m->next;
      }

      y += 16;
   }
}